

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.cpp
# Opt level: O2

void __thiscall clickhouse::Client::Impl::ExecuteQuery(Impl *this,Query *query)

{
  bool bVar1;
  string local_50;
  _Any_data local_30;
  code *local_20;
  code *local_18;
  
  this->events_ = &query->super_QueryEvents;
  if ((this->options_).ping_before_query == true) {
    local_30._8_8_ = 0;
    local_18 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/artpaul[P]clickhouse-cpp/clickhouse/client.cpp:200:20)>
               ::_M_invoke;
    local_20 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/artpaul[P]clickhouse-cpp/clickhouse/client.cpp:200:20)>
               ::_M_manager;
    local_30._M_unused._M_object = this;
    RetryGuard(this,(function<void_()> *)&local_30);
    std::_Function_base::~_Function_base((_Function_base *)&local_30);
  }
  std::__cxx11::string::string((string *)&local_50,(string *)&query->query_);
  SendQuery(this,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  do {
    bVar1 = ReceivePacket(this,(uint64_t *)0x0);
  } while (bVar1);
  this->events_ = (QueryEvents *)0x0;
  return;
}

Assistant:

void Client::Impl::ExecuteQuery(Query query) {
    EnsureNull en(static_cast<QueryEvents*>(&query), &events_);

    if (options_.ping_before_query) {
        RetryGuard([this]() { Ping(); });
    }

    SendQuery(query.GetText());

    while (ReceivePacket()) {
        ;
    }
}